

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsPendulum_dns.c
# Opt level: O0

int f(sunrealtype t,N_Vector yy,N_Vector fy,void *f_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  double *pdVar6;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar7;
  sunrealtype tmp;
  sunrealtype yd;
  sunrealtype xd;
  sunrealtype y;
  sunrealtype x;
  sunrealtype *fydata;
  sunrealtype *yydata;
  
  pdVar5 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar6 = (double *)N_VGetArrayPointer(in_RSI);
  dVar1 = *pdVar5;
  dVar2 = pdVar5[1];
  dVar3 = pdVar5[2];
  dVar4 = pdVar5[3];
  dVar7 = dVar2 * -13.750371636040745 + dVar3 * dVar3 + dVar4 * dVar4;
  *pdVar6 = dVar3;
  pdVar6[1] = dVar4;
  pdVar6[2] = -dVar1 * dVar7;
  pdVar6[3] = -dVar2 * dVar7 + -13.750371636040745;
  return 0;
}

Assistant:

static int f(sunrealtype t, N_Vector yy, N_Vector fy, void* f_data)
{
  sunrealtype* yydata = NULL; /* yy vector data */
  sunrealtype* fydata = NULL; /* fy vector data */

  sunrealtype x, y;   /* positions  */
  sunrealtype xd, yd; /* velocities */
  sunrealtype tmp;

  /* Get vector array pointers */
  yydata = N_VGetArrayPointer(yy);
  fydata = N_VGetArrayPointer(fy);

  /* Get vector components */
  x  = yydata[0];
  y  = yydata[1];
  xd = yydata[2];
  yd = yydata[3];

  /* Compute tension */
  tmp = xd * xd + yd * yd - GRAV * y;

  /* Compute RHS */
  fydata[0] = xd;
  fydata[1] = yd;
  fydata[2] = -x * tmp;
  fydata[3] = -y * tmp - GRAV;

  return (0);
}